

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

void __thiscall
Centaurus::NFABase<Centaurus::DFAState<wchar_t>_>::print
          (NFABase<Centaurus::DFAState<wchar_t>_> *this,wostream *os,wstring *graph_name)

{
  long *plVar1;
  wostream *pwVar2;
  ulong uVar3;
  pointer pDVar4;
  wchar_t wVar5;
  ulong uVar6;
  
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"digraph ",8);
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (os,(graph_name->_M_dataplus)._M_p,graph_name->_M_string_length);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" {",2);
  plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar2);
    std::wostream::flush();
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"rankdir=\"LR\";",0xd);
    plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,10);
      wVar5 = (wchar_t)os;
      std::wostream::put(wVar5);
      std::wostream::flush();
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (os,L"graph [ charset=\"UTF-8\", style=\"filled\" ];",0x2a);
      plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x50))(plVar1,10);
        std::wostream::put(wVar5);
        std::wostream::flush();
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                  (os,L"node [ style=\"solid,filled\" ];",0x1e);
        plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 0x50))(plVar1,10);
          std::wostream::put(wVar5);
          std::wostream::flush();
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                    (os,L"edge [ style=\"solid\" ];",0x17);
          plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 0x50))(plVar1,10);
            std::wostream::put(wVar5);
            std::wostream::flush();
            if ((this->m_states).
                super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (this->m_states).
                super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar6 = 0;
              do {
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"S",1);
                pwVar2 = std::wostream::_M_insert<unsigned_long>((ulong)os);
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" [ label=\"",10);
                (*this->_vptr_NFABase[2])(this,os,uVar6);
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                          (os,L"\", shape=circle ];",0x12);
                plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
                if (plVar1 == (long *)0x0) goto LAB_00147cf2;
                (**(code **)(*plVar1 + 0x50))(plVar1,10);
                std::wostream::put(wVar5);
                std::wostream::flush();
                uVar6 = (ulong)((int)uVar6 + 1);
                uVar3 = ((long)(this->m_states).
                               super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_states).
                               super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7
                ;
              } while (uVar6 <= uVar3 && uVar3 - uVar6 != 0);
            }
            pDVar4 = (this->m_states).
                     super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((this->m_states).
                super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != pDVar4) {
              uVar6 = 0;
              do {
                (*pDVar4[uVar6].super_NFABaseState<wchar_t,_Centaurus::IndexVector>.
                  _vptr_NFABaseState[2])(pDVar4 + uVar6,os,uVar6);
                uVar6 = (ulong)((int)uVar6 + 1);
                pDVar4 = (this->m_states).
                         super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar3 = ((long)(this->m_states).
                               super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar4 >> 3) *
                        -0x71c71c71c71c71c7;
              } while (uVar6 <= uVar3 && uVar3 - uVar6 != 0);
            }
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"}",1);
            plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
            if (plVar1 != (long *)0x0) {
              (**(code **)(*plVar1 + 0x50))(plVar1,10);
              std::wostream::put(wVar5);
              std::wostream::flush();
              return;
            }
          }
        }
      }
    }
  }
LAB_00147cf2:
  std::__throw_bad_cast();
}

Assistant:

virtual void print(std::wostream& os, const std::wstring& graph_name) const
	{
		os << L"digraph " << graph_name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\", style=\"filled\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << L"S" << i << L" [ label=\"";
			print_state(os, i);
			os << L"\", shape=circle ];" << std::endl;
		}

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print(os, i);
		}

		os << L"}" << std::endl;
	}